

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(int *colVals,int *rowPtr,int *consP,int base)

{
  int in_ECX;
  int iVar1;
  int *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int k_11;
  int l_1;
  int nJdata_tmp_1;
  int k_10;
  int l;
  int nJdata_tmp;
  int n;
  GpuArray<double,_9U> conc;
  GpuArray<double,_100U> Jac;
  int m;
  int k_9;
  Real dehmixdc;
  Real tmp2;
  Real tmp3;
  Real tmp1;
  Real cmixinv;
  int k_8;
  Real dehmixdT;
  Real dcmixdT;
  Real ehmix;
  Real cmix;
  Real *eh_RT;
  Real e_RT [9];
  Real dcRdT [9];
  Real c_R [9];
  int k_7;
  int k_6;
  int k_5;
  int k_4;
  int k_3;
  int k_2;
  Real log10e;
  Real ln10;
  Real dlnCorrdT;
  Real dlogFdlogPr;
  Real dlogFcentdT;
  Real dlogFdT;
  Real dlogfPrdT;
  Real dlogPrdT;
  Real dlogFdcn_fac;
  Real dlogFdn;
  Real dlogFdc;
  Real Fcent;
  Real Fcent3;
  Real Fcent2;
  Real Fcent1;
  Real troe;
  Real troePr;
  Real troePr_den;
  Real troe_n;
  Real troe_c;
  Real logFcent;
  Real logPr;
  Real k_0;
  Real F;
  Real fPr;
  Real Pr;
  Real dqdc [9];
  Real dcdc_fac;
  Real dqdci;
  Real dqdT;
  Real dkrdT;
  Real dlnKcdT;
  Real dlnk0dT;
  Real dlnkfdT;
  Real alpha;
  Real Corr;
  Real q_nocor;
  Real q;
  Real Kc;
  Real phi_r;
  Real k_r;
  Real k_f;
  Real phi_f;
  Real h_RT [9];
  Real g_RT [9];
  int k_1;
  Real mixture;
  Real refCinv;
  Real refC;
  Real invT2;
  Real invT;
  Real tc [5];
  int k;
  Real wdot [9];
  int i;
  Real invT_1;
  Real T;
  Real invT_2;
  Real T_1;
  Real T_2;
  Real T_3;
  Real T_5;
  Real T_4;
  Real invT_3;
  Real T_6;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  int local_90c;
  int local_908;
  int local_904;
  double local_900 [9];
  double local_8b8 [100];
  int local_594;
  int *local_590;
  undefined4 *local_588;
  long local_580;
  undefined4 local_574;
  double *local_570;
  int local_564;
  double *local_560;
  undefined4 local_534;
  double *local_530;
  int local_528;
  int local_524;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  int local_4f4;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double *local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_478 [10];
  double local_428 [9];
  int local_3e0;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  undefined8 local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8 [10];
  undefined8 local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  int local_184;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  int local_12c;
  double local_128 [9];
  int local_e0;
  int local_dc;
  double local_d8;
  double *local_d0;
  double *local_c8;
  double local_c0;
  double local_b8;
  double *local_b0;
  double *local_a8;
  double local_a0;
  double local_98;
  double *local_90;
  double *local_88;
  double local_80;
  double *local_78;
  double *local_70;
  double local_38;
  double *local_30;
  double *local_28;
  double local_20;
  double local_18;
  double *local_10;
  double *local_8;
  
  local_594 = in_ECX;
  local_590 = in_RDX;
  local_588 = in_RSI;
  local_580 = in_RDI;
  memset(local_8b8,0,800);
  memset(local_900,0,0x48);
  for (local_904 = 0; local_904 < 9; local_904 = local_904 + 1) {
    local_564 = local_904;
    local_560 = local_900;
    local_560[local_904] = 0.1111111111111111;
  }
  local_530 = local_8b8;
  local_534 = 0;
  local_570 = local_900;
  local_574 = 0;
  local_dc = *local_590;
  local_d8 = 1500.0;
  for (local_e0 = 0; local_e0 < 100; local_e0 = local_e0 + 1) {
    local_530[local_e0] = 0.0;
  }
  for (local_12c = 0; local_12c < 9; local_12c = local_12c + 1) {
    local_128[local_12c] = 0.0;
  }
  local_d0 = local_570;
  local_c8 = local_530;
  dVar2 = log(1500.0);
  local_150 = local_d8;
  dVar3 = local_d8 * local_d8;
  dVar4 = local_d8 * local_d8 * local_d8;
  dVar5 = local_d8 * local_d8 * local_d8 * local_d8;
  local_160 = 1.0 / local_d8;
  local_168 = local_160 * local_160;
  local_170 = 12186.6002121605 / local_d8;
  local_178 = 1.0 / local_170;
  local_180 = 0.0;
  for (local_184 = 0; local_184 < 9; local_184 = local_184 + 1) {
    local_180 = local_d0[local_184] + local_180;
  }
  local_a8 = &local_1d8;
  local_b0 = &local_158;
  local_b8 = local_d8;
  local_c0 = 1.0 / local_d8;
  if (1000.0 <= local_d8) {
    local_1d8 = dVar5 * -7.91375895e-17 +
                dVar4 * 7.692981816666667e-13 +
                dVar3 * 9.389714483333333e-09 +
                local_d8 * -0.0003500322055 +
                dVar2 * -2.99142337 + local_c0 * -835.033997 + 4.34653354;
    local_1d0 = local_138 * 5.68217655e-17 +
                local_140 * -1.479401233333333e-12 +
                local_148 * 2.098069983333333e-08 +
                local_d8 * -0.0003067598445 +
                local_158 * -3.69757819 + local_c0 * -1233.93018 + 0.5084126000000002;
    local_1c8 = local_138 * 3.195808935e-16 +
                local_140 * -1.000830325e-11 +
                local_148 * 1.455043351666667e-07 +
                local_d8 * -0.001528146445 +
                local_158 * -2.67214561 + local_c0 * -29899.209 + -4.190671200000001;
    local_1c0 = local_138 * -0.0 +
                local_140 * -0.0 +
                local_148 * -0.0 +
                local_d8 * -0.0 + local_158 * -2.5 + local_c0 * 25471.627 + 2.960117638;
    local_1b8 = local_138 * 2.18402575e-17 +
                local_140 * -3.792556183333333e-13 +
                local_148 * 5.171338916666667e-10 +
                local_d8 * 1.377530955e-05 +
                local_158 * -2.54205966 + local_c0 * 29230.8027 + -2.37824845;
    local_1b0 = local_138 * 6.6597938e-17 +
                local_140 * -2.54348895e-12 +
                local_148 * 4.318045966666667e-08 +
                local_d8 * -0.00052825224 +
                local_158 * -2.86472886 + local_c0 * 3683.62875 + -2.83691187;
    local_1a8 = local_138 * 5.39542675e-16 +
                local_140 * -9.520530833333334e-12 +
                local_148 * 1.056096916666667e-07 +
                local_d8 * -0.001119910065 +
                local_158 * -4.0172109 + local_c0 * 111.856713 + 0.2321087500000001;
    local_1a0 = local_138 * 7.1582678e-16 +
                local_140 * -1.957419641666667e-11 +
                local_148 * 2.4578147e-07 +
                local_d8 * -0.002168068195 +
                local_158 * -4.57316685 + local_c0 * -18006.9609 + 4.072029891;
    local_198 = local_138 * 3.3766755e-16 +
                local_140 * -8.4142e-12 +
                local_148 * 9.474601666666666e-08 +
                local_d8 * -0.0007439885 + local_158 * -2.92664 + local_c0 * -922.7977 + -3.053888;
  }
  else {
    local_1d8 = dVar5 * -2.06743612e-14 +
                dVar4 * 7.896195275e-12 +
                dVar3 * 1.357169215e-07 +
                local_d8 * -0.000412472087 +
                dVar2 * -3.29812431 + local_c0 * -1012.52087 + 6.5922184;
    local_1d0 = local_138 * 4.38427696e-14 +
                local_140 * -1.094897691666667e-10 +
                local_148 * 9.593584116666666e-08 +
                local_d8 * -0.000563743175 +
                local_158 * -3.2129364 + local_c0 * -1005.24902 + -2.82180119;
    local_1c8 = local_138 * 1.253294235e-13 +
                local_140 * -5.807151058333333e-10 +
                local_148 * 1.059116055e-06 +
                local_d8 * -0.00173749123 +
                local_158 * -3.38684249 + local_c0 * -30208.1133 + 0.7966096399999998;
    local_1c0 = local_138 * -0.0 +
                local_140 * -0.0 +
                local_148 * -0.0 +
                local_d8 * -0.0 + local_158 * -2.5 + local_c0 * 25471.627 + 2.960117608;
    local_1b8 = local_138 * -1.94534818e-14 +
                local_140 * 1.335702658333333e-10 +
                local_148 * -4.035052833333333e-07 +
                local_d8 * 0.000819083245 +
                local_158 * -2.94642878 + local_c0 * 29147.6445 + -0.01756619999999964;
    local_1b0 = local_138 * -1.031186895e-13 +
                local_140 * 4.832113691666666e-10 +
                local_148 * -1.087941151666667e-06 +
                local_d8 * 0.001612724695 +
                local_158 * -4.12530561 + local_c0 * 3346.30913 + 4.81573857;
    local_1a8 = local_138 * -4.646125620000001e-13 +
                local_140 * 2.02303245e-09 +
                local_148 * -3.526381516666666e-06 +
                local_d8 * 0.002374560255 +
                local_158 * -4.30179801 + local_c0 * 294.80804 + 0.5851355599999999;
    local_1a0 = local_138 * -1.235757375e-13 +
                local_140 * 3.854837933333333e-10 +
                local_148 * 2.475020966666667e-08 +
                local_d8 * -0.003284612905 +
                local_158 * -3.38875365 + local_c0 * -17663.1465 + -3.39660955;
    local_198 = local_138 * 1.2224275e-13 +
                local_140 * -4.701262500000001e-10 +
                local_148 * 6.605369999999999e-07 +
                local_d8 * -0.00070412 +
                local_158 * -3.298677 + local_c0 * -1020.9 + -0.6516950000000001;
  }
  local_88 = &local_228;
  local_90 = &local_158;
  local_98 = local_d8;
  local_a0 = 1.0 / local_d8;
  if (1000.0 <= local_d8) {
    local_228 = local_a0 * -835.033997 +
                dVar5 * 3.16550358e-16 +
                dVar4 * -2.30789455e-12 +
                dVar3 * -1.8779429e-08 + local_d8 * 0.000350032206 + 2.99142337;
    local_220 = local_a0 * -1233.93018 +
                dVar5 * -2.27287062e-16 +
                dVar4 * 4.4382037e-12 +
                dVar3 * -4.19613997e-08 + local_d8 * 0.000306759845 + 3.69757819;
    local_218 = local_a0 * -29899.209 +
                dVar5 * -1.27832357e-15 +
                dVar4 * 3.00249098e-11 +
                dVar3 * -2.9100867e-07 + local_d8 * 0.00152814644 + 2.67214561;
    local_210 = local_a0 * 25471.627 +
                dVar5 * 0.0 + dVar4 * 0.0 + dVar3 * 0.0 + local_d8 * 0.0 + 2.5;
    local_208 = local_a0 * 29230.8027 +
                dVar5 * -8.736103e-17 +
                dVar4 * 1.13776685e-12 +
                dVar3 * -1.03426778e-09 + local_d8 * -1.37753096e-05 + 2.54205966;
    local_200 = local_a0 * 3683.62875 +
                dVar5 * -2.66391752e-16 +
                dVar4 * 7.63046685e-12 +
                dVar3 * -8.63609193e-08 + local_d8 * 0.00052825224 + 2.86472886;
    local_1f8 = local_a0 * 111.856713 +
                dVar5 * -2.1581707e-15 +
                dVar4 * 2.85615925e-11 +
                dVar3 * -2.11219383e-07 + local_d8 * 0.00111991006 + 4.0172109;
    local_1f0 = local_a0 * -18006.9609 +
                dVar5 * -2.86330712e-15 +
                dVar4 * 5.87225893e-11 +
                dVar3 * -4.9156294e-07 + local_d8 * 0.0021680682 + 4.57316685;
    local_1e8 = local_a0 * -922.7977 +
                dVar5 * -1.3506702e-15 +
                dVar4 * 2.52426e-11 + dVar3 * -1.89492033e-07 + local_d8 * 0.0007439885 + 2.92664;
  }
  else {
    local_228 = local_a0 * -1012.52087 +
                dVar5 * 8.26974448e-14 +
                dVar4 * -2.36885858e-11 +
                dVar3 * -2.71433843e-07 + local_d8 * 0.000412472087 + 3.29812431;
    local_220 = local_a0 * -1005.24902 +
                dVar5 * -1.75371078e-13 +
                dVar4 * 3.28469308e-10 +
                dVar3 * -1.91871682e-07 + local_d8 * 0.000563743175 + 3.2129364;
    local_218 = local_a0 * -30208.1133 +
                dVar5 * -5.01317694e-13 +
                dVar4 * 1.74214532e-09 +
                dVar3 * -2.11823211e-06 + local_d8 * 0.00173749123 + 3.38684249;
    local_210 = local_a0 * 25471.627 +
                dVar5 * 0.0 + dVar4 * 0.0 + dVar3 * 0.0 + local_d8 * 0.0 + 2.5;
    local_208 = local_a0 * 29147.6445 +
                dVar5 * 7.78139272e-14 +
                dVar4 * -4.00710797e-10 +
                dVar3 * 8.07010567e-07 + local_d8 * -0.000819083245 + 2.94642878;
    local_200 = local_a0 * 3346.30913 +
                dVar5 * 4.12474758e-13 +
                dVar4 * -1.44963411e-09 +
                dVar3 * 2.1758823e-06 + local_d8 * -0.0016127247 + 4.12530561;
    local_1f8 = local_a0 * 294.80804 +
                dVar5 * 1.85845025e-12 +
                dVar4 * -6.06909735e-09 +
                dVar3 * 7.05276303e-06 + local_d8 * -0.00237456025 + 4.30179801;
    local_1f0 = local_a0 * -17663.1465 +
                dVar5 * 4.9430295e-13 +
                dVar4 * -1.15645138e-09 +
                dVar3 * -4.95004193e-08 + local_d8 * 0.0032846129 + 3.38875365;
    local_1e8 = local_a0 * -1020.9 +
                dVar5 * -4.88971e-13 +
                dVar4 * 1.41037875e-09 + dVar3 * -1.321074e-06 + local_d8 * 0.00070412 + 3.298677;
  }
  local_158 = dVar2;
  local_148 = dVar3;
  local_140 = dVar4;
  local_138 = dVar5;
  local_3c0 = log(10.0);
  local_3c8 = log(10.0);
  local_3c8 = 1.0 / local_3c8;
  local_270 = local_d0[2] * 10.0 + local_d0[1] * -0.21999999999999997 + local_180 + *local_d0;
  local_230 = local_d0[1] * local_d0[3];
  local_238 = exp(local_158 * 0.6 + -(local_160 * 0.0));
  local_238 = local_238 * 1475000.0;
  local_278 = local_160 * 0.6 + local_168 * 0.0;
  local_318 = exp(local_158 * -1.72 + -(local_160 * 264.08810621431707));
  local_318 = local_318 * 6.366e+20;
  local_300 = ((local_270 * 1e-12) / local_238) * local_318;
  local_308 = local_300 / (local_300 + 1.0);
  local_280 = local_160 * -1.72 + local_168 * 264.08810621431707;
  local_390 = local_3c8 * (local_280 - local_278);
  local_398 = local_390 / (local_300 + 1.0);
  local_320 = log10(local_300);
  local_358 = exp(-local_d8 / 1e-30);
  local_358 = local_358 * 0.19999999999999996;
  local_360 = exp(-local_d8 / 1e+30);
  local_360 = local_360 * 0.8;
  local_368 = 0;
  local_370 = local_358 + local_360 + 0.0;
  local_328 = log10(local_370);
  local_330 = local_328 * -0.67 + -0.4;
  local_338 = local_328 * -1.27 + 0.75;
  local_340 = 1.0 / ((local_330 + local_320) * -0.14 + local_338);
  local_348 = (local_330 + local_320) * local_340;
  local_350 = 1.0 / (local_348 * local_348 + 1.0);
  local_310 = pow(10.0,local_328 * local_350);
  dVar2 = local_178;
  local_3a8 = (local_3c8 / local_370) * (-local_358 / 1e-30 - local_360 / 1e+30);
  local_388 = local_328 * 2.0 * local_350 * local_350 * local_348 * local_340;
  local_3b0 = -local_338 * local_388 * local_340;
  local_380 = local_388 * local_348;
  local_3a0 = local_3a8 * (local_380 * -1.27 + local_3b0 * -0.67 + local_350) +
              local_3b0 * local_390;
  local_248 = local_d0[6];
  local_378 = local_3b0;
  dVar3 = exp((local_1d0 + local_1c0) - local_1a8);
  local_250 = dVar2 * dVar3;
  dVar2 = local_238 / (dVar2 * dVar3);
  local_288 = local_160 * (-(local_220 + local_210) + local_1f8 + 1.0);
  local_290 = (local_278 - local_288) * dVar2;
  local_260 = local_238 * local_230 + -(dVar2 * local_248);
  local_268 = local_308 * local_310;
  local_258 = local_268 * local_260;
  local_3b8 = local_3c0 * (local_398 + local_3a0);
  local_298 = local_268 * (local_278 * local_238 * local_230 + -(local_290 * local_248)) +
              local_3b8 * local_258;
  local_128[1] = local_128[1] - local_258;
  local_128[3] = local_128[3] - local_258;
  local_128[6] = local_258 + local_128[6];
  local_238 = local_268 * local_238;
  local_240 = local_268 * dVar2;
  local_2a8 = 0;
  local_2f8[0] = 0.0;
  local_2f8[1] = local_238 * local_d0[3] + 0.0;
  local_2f8[2] = 0.0;
  local_2f8[3] = local_238 * local_d0[1] + 0.0;
  local_2f8[4] = 0.0;
  local_2f8[5] = 0.0;
  local_2f8[6] = 0.0 - local_268 * dVar2;
  local_2f8[7] = 0.0;
  local_2f8[8] = 0.0;
  for (local_3cc = 0; local_3cc < 9; local_3cc = local_3cc + 1) {
    iVar1 = local_3cc * 10 + 1;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3cc];
    iVar1 = local_3cc * 10 + 3;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3cc];
    iVar1 = local_3cc * 10 + 6;
    local_c8[iVar1] = local_2f8[local_3cc] + local_c8[iVar1];
  }
  local_c8[0x5b] = local_c8[0x5b] - local_298;
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x60] = local_298 + local_c8[0x60];
  local_270 = local_d0[2] * 11.0 + *local_d0 * 1.5 + local_180;
  local_230 = local_d0[7];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 24370.78312492259));
  local_238 = local_238 * 295100000000000.0;
  local_278 = local_160 * 0.0 + local_168 * 24370.78312492259;
  local_318 = exp(local_158 * 0.0 + -(local_160 * 22896.35829411476));
  local_318 = local_318 * 1.202e+17;
  local_300 = ((local_270 * 1e-06) / local_238) * local_318;
  local_308 = local_300 / (local_300 + 1.0);
  local_280 = local_160 * 0.0 + local_168 * 22896.35829411476;
  local_390 = local_3c8 * (local_280 - local_278);
  local_398 = local_390 / (local_300 + 1.0);
  local_320 = log10(local_300);
  local_358 = exp(-local_d8 / 1e-30);
  local_358 = local_358 * 0.5;
  local_360 = exp(-local_d8 / 1e+30);
  local_360 = local_360 * 0.5;
  local_368 = 0;
  local_370 = local_358 + local_360 + 0.0;
  local_328 = log10(local_370);
  local_330 = local_328 * -0.67 + -0.4;
  local_338 = local_328 * -1.27 + 0.75;
  local_340 = 1.0 / ((local_330 + local_320) * -0.14 + local_338);
  local_348 = (local_330 + local_320) * local_340;
  local_350 = 1.0 / (local_348 * local_348 + 1.0);
  local_310 = pow(10.0,local_328 * local_350);
  dVar2 = local_170;
  local_3a8 = (local_3c8 / local_370) * (-local_358 / 1e-30 - local_360 / 1e+30);
  local_388 = local_328 * 2.0 * local_350 * local_350 * local_348 * local_340;
  local_3b0 = -local_338 * local_388 * local_340;
  local_380 = local_388 * local_348;
  local_3a0 = local_3a8 * (local_380 * -1.27 + local_3b0 * -0.67 + local_350) +
              local_3b0 * local_390;
  local_248 = local_d0[5] * local_d0[5];
  local_378 = local_3b0;
  dVar3 = exp(local_1a0 - (local_1b0 + local_1b0));
  local_250 = dVar2 * dVar3;
  dVar2 = local_238 / (dVar2 * dVar3);
  local_288 = local_160 * ((local_200 + local_200 + -local_1f0) - 1.0);
  local_290 = (local_278 - local_288) * dVar2;
  local_260 = local_238 * local_230 + -(dVar2 * local_248);
  local_268 = local_308 * local_310;
  local_258 = local_268 * local_260;
  local_3b8 = local_3c0 * (local_398 + local_3a0);
  local_298 = local_268 * (local_278 * local_238 * local_230 + -(local_290 * local_248)) +
              local_3b8 * local_258;
  local_128[5] = local_258 + local_258 + local_128[5];
  local_128[7] = local_128[7] - local_258;
  local_238 = local_268 * local_238;
  local_240 = local_268 * dVar2;
  local_2a8 = 0;
  local_2f8[0] = 0.0;
  local_2f8[1] = 0.0;
  local_2f8[2] = 0.0;
  local_2f8[3] = 0.0;
  local_2f8[4] = 0.0;
  local_2f8[5] = -(local_268 * dVar2 * 2.0) * local_d0[5] + 0.0;
  local_2f8[6] = 0.0;
  local_2f8[7] = local_238 + 0.0;
  local_2f8[8] = 0.0;
  for (local_3d0 = 0; local_3d0 < 9; local_3d0 = local_3d0 + 1) {
    iVar1 = local_3d0 * 10 + 5;
    local_c8[iVar1] = local_2f8[local_3d0] + local_2f8[local_3d0] + local_c8[iVar1];
    iVar1 = local_3d0 * 10 + 7;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3d0];
  }
  local_c8[0x5f] = local_298 + local_298 + local_c8[0x5f];
  local_c8[0x61] = local_c8[0x61] - local_298;
  local_270 = local_d0[2] * 11.0 + *local_d0 * 1.5 + local_180;
  local_230 = *local_d0;
  local_238 = exp(local_158 * -1.4 + -(local_160 * 52525.755576696676));
  dVar2 = local_170;
  local_238 = local_238 * 45770000000000.0;
  local_278 = local_160 * -1.4 + local_168 * 52525.755576696676;
  local_248 = local_d0[3] * local_d0[3];
  dVar3 = exp(local_1d8 - (local_1c0 + local_1c0));
  local_250 = dVar2 * dVar3;
  dVar2 = local_238 / (dVar2 * dVar3);
  local_288 = local_160 * ((local_210 + local_210 + -local_228) - 1.0);
  local_290 = (local_278 - local_288) * dVar2;
  local_260 = local_238 * local_230 + -(dVar2 * local_248);
  local_258 = local_270 * local_260;
  local_298 = local_270 * (local_278 * local_238 * local_230 + -(local_290 * local_248));
  local_128[0] = local_128[0] - local_258;
  local_128[3] = local_258 + local_258 + local_128[3];
  local_238 = local_270 * local_238;
  local_240 = local_270 * dVar2;
  local_2f8[0] = local_260 * 2.5 + local_238;
  local_2f8[1] = local_260;
  local_2f8[2] = local_260 * 12.0;
  local_2f8[3] = -(local_270 * dVar2 * 2.0) * local_d0[3] + local_260;
  local_2f8[4] = local_260;
  local_2f8[5] = local_260;
  local_2f8[6] = local_260;
  local_2f8[7] = local_260;
  local_2f8[8] = local_260;
  for (local_3d4 = 0; local_3d4 < 9; local_3d4 = local_3d4 + 1) {
    local_c8[local_3d4 * 10] = local_c8[local_3d4 * 10] - local_2f8[local_3d4];
    iVar1 = local_3d4 * 10 + 3;
    local_c8[iVar1] = local_2f8[local_3d4] + local_2f8[local_3d4] + local_c8[iVar1];
  }
  local_c8[0x5a] = local_c8[0x5a] - local_298;
  local_c8[0x5d] = local_298 + local_298 + local_c8[0x5d];
  local_270 = local_d0[2] * 11.0 + *local_d0 * 1.5 + local_180;
  local_230 = local_d0[4] * local_d0[4];
  local_238 = exp(local_158 * -0.5 + -(local_160 * 0.0));
  dVar2 = local_178;
  local_238 = local_238 * 6165.0;
  local_278 = local_160 * -0.5 + local_168 * 0.0;
  local_248 = local_d0[1];
  dVar3 = exp(local_1b8 + local_1b8 + -local_1d0);
  local_250 = dVar2 * dVar3;
  dVar2 = local_238 / (dVar2 * dVar3);
  local_288 = local_160 * ((local_220 - (local_208 + local_208)) + 1.0);
  local_290 = (local_278 - local_288) * dVar2;
  local_260 = local_238 * local_230 + -(dVar2 * local_248);
  local_258 = local_270 * local_260;
  local_298 = local_270 * (local_278 * local_238 * local_230 + -(local_290 * local_248));
  local_128[1] = local_258 + local_128[1];
  local_128[4] = local_128[4] - (local_258 + local_258);
  local_238 = local_270 * local_238;
  local_240 = local_270 * dVar2;
  local_2f8[0] = local_260 * 2.5;
  local_2f8[1] = local_260 - local_270 * dVar2;
  local_2f8[2] = local_260 * 12.0;
  local_2f8[3] = local_260;
  local_2f8[4] = local_238 * 2.0 * local_d0[4] + local_260;
  local_2f8[5] = local_260;
  local_2f8[6] = local_260;
  local_2f8[7] = local_260;
  local_2f8[8] = local_260;
  for (local_3d8 = 0; local_3d8 < 9; local_3d8 = local_3d8 + 1) {
    iVar1 = local_3d8 * 10 + 1;
    local_c8[iVar1] = local_2f8[local_3d8] + local_c8[iVar1];
    iVar1 = local_3d8 * 10 + 4;
    local_c8[iVar1] = local_c8[iVar1] - (local_2f8[local_3d8] + local_2f8[local_3d8]);
  }
  local_c8[0x5b] = local_298 + local_c8[0x5b];
  local_c8[0x5e] = local_c8[0x5e] - (local_298 + local_298);
  local_270 = local_d0[2] * 11.0 + *local_d0 * 1.5 + local_180;
  local_230 = local_d0[3] * local_d0[4];
  local_238 = exp(-(local_160 * 0.0) - local_158);
  dVar2 = local_178;
  local_238 = local_238 * 4714000.0;
  local_278 = local_168 * 0.0 - local_160;
  local_248 = local_d0[5];
  dVar3 = exp((local_1c0 + local_1b8) - local_1b0);
  local_250 = dVar2 * dVar3;
  dVar2 = local_238 / (dVar2 * dVar3);
  local_288 = local_160 * (-(local_210 + local_208) + local_200 + 1.0);
  local_290 = (local_278 - local_288) * dVar2;
  local_260 = local_238 * local_230 + -(dVar2 * local_248);
  local_258 = local_270 * local_260;
  local_298 = local_270 * (local_278 * local_238 * local_230 + -(local_290 * local_248));
  local_128[3] = local_128[3] - local_258;
  local_128[4] = local_128[4] - local_258;
  local_128[5] = local_258 + local_128[5];
  local_238 = local_270 * local_238;
  local_240 = local_270 * dVar2;
  local_2f8[0] = local_260 * 2.5;
  local_2f8[1] = local_260;
  local_2f8[2] = local_260 * 12.0;
  local_2f8[3] = local_238 * local_d0[4] + local_260;
  local_2f8[4] = local_238 * local_d0[3] + local_260;
  local_2f8[5] = local_260 - local_270 * dVar2;
  local_2f8[6] = local_260;
  local_2f8[7] = local_260;
  local_2f8[8] = local_260;
  for (local_3dc = 0; local_3dc < 9; local_3dc = local_3dc + 1) {
    iVar1 = local_3dc * 10 + 3;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3dc];
    iVar1 = local_3dc * 10 + 4;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3dc];
    iVar1 = local_3dc * 10 + 5;
    local_c8[iVar1] = local_2f8[local_3dc] + local_c8[iVar1];
  }
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x5e] = local_c8[0x5e] - local_298;
  local_c8[0x5f] = local_298 + local_c8[0x5f];
  local_270 = local_d0[2] * 11.0 + *local_d0 * 1.5 + local_180;
  local_230 = local_d0[3] * local_d0[5];
  local_238 = exp(-(local_160 * 0.0) - (local_158 + local_158));
  dVar2 = local_178;
  local_238 = local_238 * 38000000000.0;
  local_278 = local_168 * 0.0 - (local_160 + local_160);
  local_248 = local_d0[2];
  dVar3 = exp(-local_1c8 + local_1c0 + local_1b0);
  local_250 = dVar2 * dVar3;
  dVar2 = local_238 / (dVar2 * dVar3);
  local_288 = local_160 * (-(local_210 + local_200) + local_218 + 1.0);
  local_290 = (local_278 - local_288) * dVar2;
  local_260 = local_238 * local_230 + -(dVar2 * local_248);
  local_258 = local_270 * local_260;
  local_298 = local_270 * (local_278 * local_238 * local_230 + -(local_290 * local_248));
  local_128[2] = local_258 + local_128[2];
  local_128[3] = local_128[3] - local_258;
  local_128[5] = local_128[5] - local_258;
  local_238 = local_270 * local_238;
  local_240 = local_270 * dVar2;
  local_2f8[0] = local_260 * 2.5;
  local_2f8[1] = local_260;
  local_2f8[2] = local_260 * 12.0 + -(local_270 * dVar2);
  local_2f8[3] = local_238 * local_d0[5] + local_260;
  local_2f8[4] = local_260;
  local_2f8[5] = local_238 * local_d0[3] + local_260;
  local_2f8[6] = local_260;
  local_2f8[7] = local_260;
  local_2f8[8] = local_260;
  for (local_3e0 = 0; local_3e0 < 9; local_3e0 = local_3e0 + 1) {
    iVar1 = local_3e0 * 10 + 2;
    local_c8[iVar1] = local_2f8[local_3e0] + local_c8[iVar1];
    iVar1 = local_3e0 * 10 + 3;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3e0];
    iVar1 = local_3e0 * 10 + 5;
    local_c8[iVar1] = local_c8[iVar1] - local_2f8[local_3e0];
  }
  local_c8[0x5c] = local_298 + local_c8[0x5c];
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x5f] = local_c8[0x5f] - local_298;
  local_230 = local_d0[1] * local_d0[3];
  local_238 = exp(local_158 * -0.406 + -(local_160 * 8352.893435692547));
  local_238 = local_238 * 3547000000.0;
  local_278 = local_160 * -0.406 + local_168 * 8352.893435692547;
  local_248 = local_d0[4] * local_d0[5];
  local_250 = exp(((local_1d0 + local_1c0) - local_1b8) - local_1b0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_220 + local_210) + local_208 + local_200);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[1] = local_128[1] - local_258;
  local_128[3] = local_128[3] - local_258;
  local_128[4] = local_258 + local_128[4];
  local_128[5] = local_258 + local_128[5];
  local_2a0 = local_238 * local_d0[3];
  local_c8[0xb] = local_c8[0xb] - local_2a0;
  local_c8[0xd] = local_c8[0xd] - local_2a0;
  local_c8[0xe] = local_2a0 + local_c8[0xe];
  local_c8[0xf] = local_2a0 + local_c8[0xf];
  local_2a0 = local_238 * local_d0[1];
  local_c8[0x1f] = local_c8[0x1f] - local_2a0;
  local_c8[0x21] = local_c8[0x21] - local_2a0;
  local_c8[0x22] = local_2a0 + local_c8[0x22];
  local_c8[0x23] = local_2a0 + local_c8[0x23];
  local_2a0 = -local_240 * local_d0[5];
  local_c8[0x29] = local_c8[0x29] - local_2a0;
  local_c8[0x2b] = local_c8[0x2b] - local_2a0;
  local_c8[0x2c] = local_2a0 + local_c8[0x2c];
  local_c8[0x2d] = local_2a0 + local_c8[0x2d];
  local_2a0 = -local_240 * local_d0[4];
  local_c8[0x33] = local_c8[0x33] - local_2a0;
  local_c8[0x35] = local_c8[0x35] - local_2a0;
  local_c8[0x36] = local_2a0 + local_c8[0x36];
  local_c8[0x37] = local_2a0 + local_c8[0x37];
  local_c8[0x5b] = local_c8[0x5b] - local_298;
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x5e] = local_298 + local_c8[0x5e];
  local_c8[0x5f] = local_298 + local_c8[0x5f];
  local_230 = *local_d0 * local_d0[4];
  local_238 = exp(local_158 * 2.67 + -(local_160 * 3165.232827911689));
  local_238 = local_238 * 0.0508;
  local_278 = local_160 * 2.67 + local_168 * 3165.232827911689;
  local_248 = local_d0[3] * local_d0[5];
  local_250 = exp(((local_1d8 - local_1c0) + local_1b8) - local_1b0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_228 + local_208) + local_210 + local_200);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[0] = local_128[0] - local_258;
  local_128[3] = local_258 + local_128[3];
  local_128[4] = local_128[4] - local_258;
  local_128[5] = local_258 + local_128[5];
  local_2a0 = local_238 * local_d0[4];
  *local_c8 = *local_c8 - local_2a0;
  local_c8[3] = local_2a0 + local_c8[3];
  local_c8[4] = local_c8[4] - local_2a0;
  local_c8[5] = local_2a0 + local_c8[5];
  local_2a0 = -local_240 * local_d0[5];
  local_c8[0x1e] = local_c8[0x1e] - local_2a0;
  local_c8[0x21] = local_2a0 + local_c8[0x21];
  local_c8[0x22] = local_c8[0x22] - local_2a0;
  local_c8[0x23] = local_2a0 + local_c8[0x23];
  local_2a0 = local_238 * *local_d0;
  local_c8[0x28] = local_c8[0x28] - local_2a0;
  local_c8[0x2b] = local_2a0 + local_c8[0x2b];
  local_c8[0x2c] = local_c8[0x2c] - local_2a0;
  local_c8[0x2d] = local_2a0 + local_c8[0x2d];
  local_2a0 = -local_240 * local_d0[3];
  local_c8[0x32] = local_c8[0x32] - local_2a0;
  local_c8[0x35] = local_2a0 + local_c8[0x35];
  local_c8[0x36] = local_c8[0x36] - local_2a0;
  local_c8[0x37] = local_2a0 + local_c8[0x37];
  local_c8[0x5a] = local_c8[0x5a] - local_298;
  local_c8[0x5d] = local_298 + local_c8[0x5d];
  local_c8[0x5e] = local_c8[0x5e] - local_298;
  local_c8[0x5f] = local_298 + local_c8[0x5f];
  local_230 = *local_d0 * local_d0[5];
  local_238 = exp(local_158 * 1.51 + -(local_160 * 1726.0331637101897));
  local_238 = local_238 * 216.0;
  local_278 = local_160 * 1.51 + local_168 * 1726.0331637101897;
  local_248 = local_d0[2] * local_d0[3];
  local_250 = exp(((local_1d8 - local_1c8) - local_1c0) + local_1b0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_228 + local_200) + local_218 + local_210);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[0] = local_128[0] - local_258;
  local_128[2] = local_258 + local_128[2];
  local_128[3] = local_258 + local_128[3];
  local_128[5] = local_128[5] - local_258;
  local_2a0 = local_238 * local_d0[5];
  *local_c8 = *local_c8 - local_2a0;
  local_c8[2] = local_2a0 + local_c8[2];
  local_c8[3] = local_2a0 + local_c8[3];
  local_c8[5] = local_c8[5] - local_2a0;
  local_2a0 = -local_240 * local_d0[3];
  local_c8[0x14] = local_c8[0x14] - local_2a0;
  local_c8[0x16] = local_2a0 + local_c8[0x16];
  local_c8[0x17] = local_2a0 + local_c8[0x17];
  local_c8[0x19] = local_c8[0x19] - local_2a0;
  local_2a0 = -local_240 * local_d0[2];
  local_c8[0x1e] = local_c8[0x1e] - local_2a0;
  local_c8[0x20] = local_2a0 + local_c8[0x20];
  local_c8[0x21] = local_2a0 + local_c8[0x21];
  local_c8[0x23] = local_c8[0x23] - local_2a0;
  local_2a0 = local_238 * *local_d0;
  local_c8[0x32] = local_c8[0x32] - local_2a0;
  local_c8[0x34] = local_2a0 + local_c8[0x34];
  local_c8[0x35] = local_2a0 + local_c8[0x35];
  local_c8[0x37] = local_c8[0x37] - local_2a0;
  local_c8[0x5a] = local_c8[0x5a] - local_298;
  local_c8[0x5c] = local_298 + local_c8[0x5c];
  local_c8[0x5d] = local_298 + local_c8[0x5d];
  local_c8[0x5f] = local_c8[0x5f] - local_298;
  local_230 = local_d0[2] * local_d0[4];
  local_238 = exp(local_158 * 2.02 + -(local_160 * 6743.103321783248));
  local_238 = local_238 * 2.97;
  local_278 = local_160 * 2.02 + local_168 * 6743.103321783248;
  local_248 = local_d0[5] * local_d0[5];
  local_250 = exp((local_1c8 + local_1b8) - (local_1b0 + local_1b0));
  local_240 = local_238 / local_250;
  local_288 = local_160 * (local_200 + local_200 + -(local_218 + local_208));
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[2] = local_128[2] - local_258;
  local_128[4] = local_128[4] - local_258;
  local_128[5] = local_258 + local_258 + local_128[5];
  local_2a0 = local_238 * local_d0[4];
  local_c8[0x16] = local_c8[0x16] - local_2a0;
  local_c8[0x18] = local_c8[0x18] - local_2a0;
  local_c8[0x19] = local_2a0 + local_2a0 + local_c8[0x19];
  local_2a0 = local_238 * local_d0[2];
  local_c8[0x2a] = local_c8[0x2a] - local_2a0;
  local_c8[0x2c] = local_c8[0x2c] - local_2a0;
  local_c8[0x2d] = local_2a0 + local_2a0 + local_c8[0x2d];
  local_2a0 = -local_240 * 2.0 * local_d0[5];
  local_c8[0x34] = local_c8[0x34] - local_2a0;
  local_c8[0x36] = local_c8[0x36] - local_2a0;
  local_c8[0x37] = local_2a0 + local_2a0 + local_c8[0x37];
  local_c8[0x5c] = local_c8[0x5c] - local_298;
  local_c8[0x5e] = local_c8[0x5e] - local_298;
  local_c8[0x5f] = local_298 + local_298 + local_c8[0x5f];
  local_230 = local_d0[3] * local_d0[6];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 414.1473159572846));
  local_238 = local_238 * 16600000.0;
  local_278 = local_160 * 0.0 + local_168 * 414.1473159572846;
  local_248 = *local_d0 * local_d0[1];
  local_250 = exp((-local_1d8 - local_1d0) + local_1c0 + local_1a8);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_210 + local_1f8) + local_228 + local_220);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[0] = local_258 + local_128[0];
  local_128[1] = local_258 + local_128[1];
  local_128[3] = local_128[3] - local_258;
  local_128[6] = local_128[6] - local_258;
  local_2a0 = -local_240 * local_d0[1];
  *local_c8 = local_2a0 + *local_c8;
  local_c8[1] = local_2a0 + local_c8[1];
  local_c8[3] = local_c8[3] - local_2a0;
  local_c8[6] = local_c8[6] - local_2a0;
  local_2a0 = -local_240 * *local_d0;
  local_c8[10] = local_2a0 + local_c8[10];
  local_c8[0xb] = local_2a0 + local_c8[0xb];
  local_c8[0xd] = local_c8[0xd] - local_2a0;
  local_c8[0x10] = local_c8[0x10] - local_2a0;
  local_2a0 = local_238 * local_d0[6];
  local_c8[0x1e] = local_2a0 + local_c8[0x1e];
  local_c8[0x1f] = local_2a0 + local_c8[0x1f];
  local_c8[0x21] = local_c8[0x21] - local_2a0;
  local_c8[0x24] = local_c8[0x24] - local_2a0;
  local_2a0 = local_238 * local_d0[3];
  local_c8[0x3c] = local_2a0 + local_c8[0x3c];
  local_c8[0x3d] = local_2a0 + local_c8[0x3d];
  local_c8[0x3f] = local_c8[0x3f] - local_2a0;
  local_c8[0x42] = local_c8[0x42] - local_2a0;
  local_c8[0x5a] = local_298 + local_c8[0x5a];
  local_c8[0x5b] = local_298 + local_c8[0x5b];
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x60] = local_c8[0x60] - local_298;
  local_230 = local_d0[3] * local_d0[6];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 148.4489164123924));
  local_238 = local_238 * 70790000.0;
  local_278 = local_160 * 0.0 + local_168 * 148.4489164123924;
  local_248 = local_d0[5] * local_d0[5];
  local_250 = exp((local_1c0 - (local_1b0 + local_1b0)) + local_1a8);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (local_200 + local_200 + -(local_210 + local_1f8));
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[3] = local_128[3] - local_258;
  local_128[5] = local_258 + local_258 + local_128[5];
  local_128[6] = local_128[6] - local_258;
  local_2a0 = local_238 * local_d0[6];
  local_c8[0x21] = local_c8[0x21] - local_2a0;
  local_c8[0x23] = local_2a0 + local_2a0 + local_c8[0x23];
  local_c8[0x24] = local_c8[0x24] - local_2a0;
  local_2a0 = -local_240 * 2.0 * local_d0[5];
  local_c8[0x35] = local_c8[0x35] - local_2a0;
  local_c8[0x37] = local_2a0 + local_2a0 + local_c8[0x37];
  local_c8[0x38] = local_c8[0x38] - local_2a0;
  local_2a0 = local_238 * local_d0[3];
  local_c8[0x3f] = local_c8[0x3f] - local_2a0;
  local_c8[0x41] = local_2a0 + local_2a0 + local_c8[0x41];
  local_c8[0x42] = local_c8[0x42] - local_2a0;
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x5f] = local_298 + local_298 + local_c8[0x5f];
  local_c8[0x60] = local_c8[0x60] - local_298;
  local_230 = local_d0[4] * local_d0[6];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 0.0));
  local_238 = local_238 * 32500000.0;
  local_278 = local_160 * 0.0 + local_168 * 0.0;
  local_248 = local_d0[1] * local_d0[5];
  local_250 = exp(((-local_1d0 + local_1b8) - local_1b0) + local_1a8);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_208 + local_1f8) + local_220 + local_200);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[1] = local_258 + local_128[1];
  local_128[4] = local_128[4] - local_258;
  local_128[5] = local_258 + local_128[5];
  local_128[6] = local_128[6] - local_258;
  local_2a0 = -local_240 * local_d0[5];
  local_c8[0xb] = local_2a0 + local_c8[0xb];
  local_c8[0xe] = local_c8[0xe] - local_2a0;
  local_c8[0xf] = local_2a0 + local_c8[0xf];
  local_c8[0x10] = local_c8[0x10] - local_2a0;
  local_2a0 = local_238 * local_d0[6];
  local_c8[0x29] = local_2a0 + local_c8[0x29];
  local_c8[0x2c] = local_c8[0x2c] - local_2a0;
  local_c8[0x2d] = local_2a0 + local_c8[0x2d];
  local_c8[0x2e] = local_c8[0x2e] - local_2a0;
  local_2a0 = -local_240 * local_d0[1];
  local_c8[0x33] = local_2a0 + local_c8[0x33];
  local_c8[0x36] = local_c8[0x36] - local_2a0;
  local_c8[0x37] = local_2a0 + local_c8[0x37];
  local_c8[0x38] = local_c8[0x38] - local_2a0;
  local_2a0 = local_238 * local_d0[4];
  local_c8[0x3d] = local_2a0 + local_c8[0x3d];
  local_c8[0x40] = local_c8[0x40] - local_2a0;
  local_c8[0x41] = local_2a0 + local_c8[0x41];
  local_c8[0x42] = local_c8[0x42] - local_2a0;
  local_c8[0x5b] = local_298 + local_c8[0x5b];
  local_c8[0x5e] = local_c8[0x5e] - local_298;
  local_c8[0x5f] = local_298 + local_c8[0x5f];
  local_c8[0x60] = local_c8[0x60] - local_298;
  local_230 = local_d0[5] * local_d0[6];
  local_238 = exp(local_158 * 0.0 + -(local_160 * -250.09868290494586));
  local_238 = local_238 * 28900000.0;
  local_278 = local_160 * 0.0 + local_168 * -250.09868290494586;
  local_248 = local_d0[1] * local_d0[2];
  local_250 = exp((-local_1d0 - local_1c8) + local_1b0 + local_1a8);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_200 + local_1f8) + local_220 + local_218);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[1] = local_258 + local_128[1];
  local_128[2] = local_258 + local_128[2];
  local_128[5] = local_128[5] - local_258;
  local_128[6] = local_128[6] - local_258;
  local_2a0 = -local_240 * local_d0[2];
  local_c8[0xb] = local_2a0 + local_c8[0xb];
  local_c8[0xc] = local_2a0 + local_c8[0xc];
  local_c8[0xf] = local_c8[0xf] - local_2a0;
  local_c8[0x10] = local_c8[0x10] - local_2a0;
  local_2a0 = -local_240 * local_d0[1];
  local_c8[0x15] = local_2a0 + local_c8[0x15];
  local_c8[0x16] = local_2a0 + local_c8[0x16];
  local_c8[0x19] = local_c8[0x19] - local_2a0;
  local_c8[0x1a] = local_c8[0x1a] - local_2a0;
  local_2a0 = local_238 * local_d0[6];
  local_c8[0x33] = local_2a0 + local_c8[0x33];
  local_c8[0x34] = local_2a0 + local_c8[0x34];
  local_c8[0x37] = local_c8[0x37] - local_2a0;
  local_c8[0x38] = local_c8[0x38] - local_2a0;
  local_2a0 = local_238 * local_d0[5];
  local_c8[0x3d] = local_2a0 + local_c8[0x3d];
  local_c8[0x3e] = local_2a0 + local_c8[0x3e];
  local_c8[0x41] = local_c8[0x41] - local_2a0;
  local_c8[0x42] = local_c8[0x42] - local_2a0;
  local_c8[0x5b] = local_298 + local_c8[0x5b];
  local_c8[0x5c] = local_298 + local_c8[0x5c];
  local_c8[0x5f] = local_c8[0x5f] - local_298;
  local_c8[0x60] = local_c8[0x60] - local_298;
  local_230 = local_d0[6] * local_d0[6];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 6029.542089672155));
  local_238 = local_238 * 420000000.0;
  local_278 = local_160 * 0.0 + local_168 * 6029.542089672155;
  local_248 = local_d0[1] * local_d0[7];
  local_250 = exp((local_1a8 + local_1a8 + -local_1d0) - local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * ((local_220 + local_1f0) - (local_1f8 + local_1f8));
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[1] = local_258 + local_128[1];
  local_128[6] = local_128[6] - (local_258 + local_258);
  local_128[7] = local_258 + local_128[7];
  local_2a0 = -local_240 * local_d0[7];
  local_c8[0xb] = local_2a0 + local_c8[0xb];
  local_c8[0x10] = local_c8[0x10] - (local_2a0 + local_2a0);
  local_c8[0x11] = local_2a0 + local_c8[0x11];
  local_2a0 = local_238 * 2.0 * local_d0[6];
  local_c8[0x3d] = local_2a0 + local_c8[0x3d];
  local_c8[0x42] = local_c8[0x42] - (local_2a0 + local_2a0);
  local_c8[0x43] = local_2a0 + local_c8[0x43];
  local_2a0 = -local_240 * local_d0[1];
  local_c8[0x47] = local_2a0 + local_c8[0x47];
  local_c8[0x4c] = local_c8[0x4c] - (local_2a0 + local_2a0);
  local_c8[0x4d] = local_2a0 + local_c8[0x4d];
  local_c8[0x5b] = local_298 + local_c8[0x5b];
  local_c8[0x60] = local_c8[0x60] - (local_298 + local_298);
  local_c8[0x61] = local_298 + local_c8[0x61];
  local_230 = local_d0[6] * local_d0[6];
  local_238 = exp(local_158 * 0.0 + -(local_160 * -819.8909135956303));
  local_238 = local_238 * 130000.0;
  local_278 = local_160 * 0.0 + local_168 * -819.8909135956303;
  local_248 = local_d0[1] * local_d0[7];
  local_250 = exp((local_1a8 + local_1a8 + -local_1d0) - local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * ((local_220 + local_1f0) - (local_1f8 + local_1f8));
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[1] = local_258 + local_128[1];
  local_128[6] = local_128[6] - (local_258 + local_258);
  local_128[7] = local_258 + local_128[7];
  local_2a0 = -local_240 * local_d0[7];
  local_c8[0xb] = local_2a0 + local_c8[0xb];
  local_c8[0x10] = local_c8[0x10] - (local_2a0 + local_2a0);
  local_c8[0x11] = local_2a0 + local_c8[0x11];
  local_2a0 = local_238 * 2.0 * local_d0[6];
  local_c8[0x3d] = local_2a0 + local_c8[0x3d];
  local_c8[0x42] = local_c8[0x42] - (local_2a0 + local_2a0);
  local_c8[0x43] = local_2a0 + local_c8[0x43];
  local_2a0 = -local_240 * local_d0[1];
  local_c8[0x47] = local_2a0 + local_c8[0x47];
  local_c8[0x4c] = local_c8[0x4c] - (local_2a0 + local_2a0);
  local_c8[0x4d] = local_2a0 + local_c8[0x4d];
  local_c8[0x5b] = local_298 + local_c8[0x5b];
  local_c8[0x60] = local_c8[0x60] - (local_298 + local_298);
  local_c8[0x61] = local_298 + local_c8[0x61];
  local_230 = local_d0[3] * local_d0[7];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 1997.7701632447386));
  local_238 = local_238 * 24100000.0;
  local_278 = local_160 * 0.0 + local_168 * 1997.7701632447386;
  local_248 = local_d0[2] * local_d0[5];
  local_250 = exp(((-local_1c8 + local_1c0) - local_1b0) + local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_210 + local_1f0) + local_218 + local_200);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[2] = local_258 + local_128[2];
  local_128[3] = local_128[3] - local_258;
  local_128[5] = local_258 + local_128[5];
  local_128[7] = local_128[7] - local_258;
  local_2a0 = -local_240 * local_d0[5];
  local_c8[0x16] = local_2a0 + local_c8[0x16];
  local_c8[0x17] = local_c8[0x17] - local_2a0;
  local_c8[0x19] = local_2a0 + local_c8[0x19];
  local_c8[0x1b] = local_c8[0x1b] - local_2a0;
  local_2a0 = local_238 * local_d0[7];
  local_c8[0x20] = local_2a0 + local_c8[0x20];
  local_c8[0x21] = local_c8[0x21] - local_2a0;
  local_c8[0x23] = local_2a0 + local_c8[0x23];
  local_c8[0x25] = local_c8[0x25] - local_2a0;
  local_2a0 = -local_240 * local_d0[2];
  local_c8[0x34] = local_2a0 + local_c8[0x34];
  local_c8[0x35] = local_c8[0x35] - local_2a0;
  local_c8[0x37] = local_2a0 + local_c8[0x37];
  local_c8[0x39] = local_c8[0x39] - local_2a0;
  local_2a0 = local_238 * local_d0[3];
  local_c8[0x48] = local_2a0 + local_c8[0x48];
  local_c8[0x49] = local_c8[0x49] - local_2a0;
  local_c8[0x4b] = local_2a0 + local_c8[0x4b];
  local_c8[0x4d] = local_c8[0x4d] - local_2a0;
  local_c8[0x5c] = local_298 + local_c8[0x5c];
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x5f] = local_298 + local_c8[0x5f];
  local_c8[0x61] = local_c8[0x61] - local_298;
  local_230 = local_d0[3] * local_d0[7];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 4000.5724931475243));
  local_238 = local_238 * 48200000.0;
  local_278 = local_160 * 0.0 + local_168 * 4000.5724931475243;
  local_248 = *local_d0 * local_d0[6];
  local_250 = exp(((-local_1d8 + local_1c0) - local_1a8) + local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_210 + local_1f0) + local_228 + local_1f8);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[0] = local_258 + local_128[0];
  local_128[3] = local_128[3] - local_258;
  local_128[6] = local_258 + local_128[6];
  local_128[7] = local_128[7] - local_258;
  local_2a0 = -local_240 * local_d0[6];
  *local_c8 = local_2a0 + *local_c8;
  local_c8[3] = local_c8[3] - local_2a0;
  local_c8[6] = local_2a0 + local_c8[6];
  local_c8[7] = local_c8[7] - local_2a0;
  local_2a0 = local_238 * local_d0[7];
  local_c8[0x1e] = local_2a0 + local_c8[0x1e];
  local_c8[0x21] = local_c8[0x21] - local_2a0;
  local_c8[0x24] = local_2a0 + local_c8[0x24];
  local_c8[0x25] = local_c8[0x25] - local_2a0;
  local_2a0 = -local_240 * *local_d0;
  local_c8[0x3c] = local_2a0 + local_c8[0x3c];
  local_c8[0x3f] = local_c8[0x3f] - local_2a0;
  local_c8[0x42] = local_2a0 + local_c8[0x42];
  local_c8[0x43] = local_c8[0x43] - local_2a0;
  local_2a0 = local_238 * local_d0[3];
  local_c8[0x46] = local_2a0 + local_c8[0x46];
  local_c8[0x49] = local_c8[0x49] - local_2a0;
  local_c8[0x4c] = local_2a0 + local_c8[0x4c];
  local_c8[0x4d] = local_c8[0x4d] - local_2a0;
  local_c8[0x5a] = local_298 + local_c8[0x5a];
  local_c8[0x5d] = local_c8[0x5d] - local_298;
  local_c8[0x60] = local_298 + local_c8[0x60];
  local_c8[0x61] = local_c8[0x61] - local_298;
  local_230 = local_d0[4] * local_d0[7];
  local_238 = exp(local_158 + local_158 + -(local_160 * 1997.7701632447386));
  local_238 = local_238 * 9.55;
  local_278 = local_160 + local_160 + local_168 * 1997.7701632447386;
  local_248 = local_d0[5] * local_d0[6];
  local_250 = exp(((local_1b8 - local_1b0) - local_1a8) + local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_208 + local_1f0) + local_200 + local_1f8);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[4] = local_128[4] - local_258;
  local_128[5] = local_258 + local_128[5];
  local_128[6] = local_258 + local_128[6];
  local_128[7] = local_128[7] - local_258;
  local_2a0 = local_238 * local_d0[7];
  local_c8[0x2c] = local_c8[0x2c] - local_2a0;
  local_c8[0x2d] = local_2a0 + local_c8[0x2d];
  local_c8[0x2e] = local_2a0 + local_c8[0x2e];
  local_c8[0x2f] = local_c8[0x2f] - local_2a0;
  local_2a0 = -local_240 * local_d0[6];
  local_c8[0x36] = local_c8[0x36] - local_2a0;
  local_c8[0x37] = local_2a0 + local_c8[0x37];
  local_c8[0x38] = local_2a0 + local_c8[0x38];
  local_c8[0x39] = local_c8[0x39] - local_2a0;
  local_2a0 = -local_240 * local_d0[5];
  local_c8[0x40] = local_c8[0x40] - local_2a0;
  local_c8[0x41] = local_2a0 + local_c8[0x41];
  local_c8[0x42] = local_2a0 + local_c8[0x42];
  local_c8[0x43] = local_c8[0x43] - local_2a0;
  local_2a0 = local_238 * local_d0[4];
  local_c8[0x4a] = local_c8[0x4a] - local_2a0;
  local_c8[0x4b] = local_2a0 + local_c8[0x4b];
  local_c8[0x4c] = local_2a0 + local_c8[0x4c];
  local_c8[0x4d] = local_c8[0x4d] - local_2a0;
  local_c8[0x5e] = local_c8[0x5e] - local_298;
  local_c8[0x5f] = local_298 + local_c8[0x5f];
  local_c8[0x60] = local_298 + local_c8[0x60];
  local_c8[0x61] = local_c8[0x61] - local_298;
  local_230 = local_d0[5] * local_d0[7];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 0.0));
  local_238 = local_238 * 1000000.0;
  local_278 = local_160 * 0.0 + local_168 * 0.0;
  local_248 = local_d0[2] * local_d0[6];
  local_250 = exp(((-local_1c8 + local_1b0) - local_1a8) + local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_200 + local_1f0) + local_218 + local_1f8);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[2] = local_258 + local_128[2];
  local_128[5] = local_128[5] - local_258;
  local_128[6] = local_258 + local_128[6];
  local_128[7] = local_128[7] - local_258;
  local_2a0 = -local_240 * local_d0[6];
  local_c8[0x16] = local_2a0 + local_c8[0x16];
  local_c8[0x19] = local_c8[0x19] - local_2a0;
  local_c8[0x1a] = local_2a0 + local_c8[0x1a];
  local_c8[0x1b] = local_c8[0x1b] - local_2a0;
  local_2a0 = local_238 * local_d0[7];
  local_c8[0x34] = local_2a0 + local_c8[0x34];
  local_c8[0x37] = local_c8[0x37] - local_2a0;
  local_c8[0x38] = local_2a0 + local_c8[0x38];
  local_c8[0x39] = local_c8[0x39] - local_2a0;
  local_2a0 = -local_240 * local_d0[2];
  local_c8[0x3e] = local_2a0 + local_c8[0x3e];
  local_c8[0x41] = local_c8[0x41] - local_2a0;
  local_c8[0x42] = local_2a0 + local_c8[0x42];
  local_c8[0x43] = local_c8[0x43] - local_2a0;
  local_2a0 = local_238 * local_d0[5];
  local_c8[0x48] = local_2a0 + local_c8[0x48];
  local_c8[0x4b] = local_c8[0x4b] - local_2a0;
  local_c8[0x4c] = local_2a0 + local_c8[0x4c];
  local_c8[0x4d] = local_c8[0x4d] - local_2a0;
  local_c8[0x5c] = local_298 + local_c8[0x5c];
  local_c8[0x5f] = local_c8[0x5f] - local_298;
  local_c8[0x60] = local_298 + local_c8[0x60];
  local_c8[0x61] = local_c8[0x61] - local_298;
  local_230 = local_d0[5] * local_d0[7];
  local_238 = exp(local_158 * 0.0 + -(local_160 * 4809.241675095709));
  local_238 = local_238 * 580000000.0;
  local_278 = local_160 * 0.0 + local_168 * 4809.241675095709;
  local_248 = local_d0[2] * local_d0[6];
  local_250 = exp(((-local_1c8 + local_1b0) - local_1a8) + local_1a0);
  local_240 = local_238 / local_250;
  local_288 = local_160 * (-(local_200 + local_1f0) + local_218 + local_1f8);
  local_290 = (local_278 - local_288) * local_240;
  local_258 = local_238 * local_230 + -(local_240 * local_248);
  local_298 = local_278 * local_238 * local_230 + -(local_290 * local_248);
  local_128[2] = local_258 + local_128[2];
  local_128[5] = local_128[5] - local_258;
  local_128[6] = local_258 + local_128[6];
  local_128[7] = local_128[7] - local_258;
  local_2a0 = -local_240 * local_d0[6];
  local_c8[0x16] = local_2a0 + local_c8[0x16];
  local_c8[0x19] = local_c8[0x19] - local_2a0;
  local_c8[0x1a] = local_2a0 + local_c8[0x1a];
  local_c8[0x1b] = local_c8[0x1b] - local_2a0;
  local_2a0 = local_238 * local_d0[7];
  local_c8[0x34] = local_2a0 + local_c8[0x34];
  local_c8[0x37] = local_c8[0x37] - local_2a0;
  local_c8[0x38] = local_2a0 + local_c8[0x38];
  local_c8[0x39] = local_c8[0x39] - local_2a0;
  local_2a0 = -local_240 * local_d0[2];
  local_c8[0x3e] = local_2a0 + local_c8[0x3e];
  local_c8[0x41] = local_c8[0x41] - local_2a0;
  local_c8[0x42] = local_2a0 + local_c8[0x42];
  local_c8[0x43] = local_c8[0x43] - local_2a0;
  local_2a0 = local_238 * local_d0[5];
  local_c8[0x48] = local_238 * local_d0[5] + local_c8[0x48];
  local_c8[0x4b] = local_c8[0x4b] - local_2a0;
  local_c8[0x4c] = local_2a0 + local_c8[0x4c];
  local_c8[0x4d] = local_c8[0x4d] - local_2a0;
  local_c8[0x5c] = local_298 + local_c8[0x5c];
  local_c8[0x5f] = local_c8[0x5f] - local_298;
  local_c8[0x60] = local_298 + local_c8[0x60];
  local_c8[0x61] = local_c8[0x61] - local_298;
  if (local_dc == 0) {
    local_28 = local_428;
    local_30 = &local_158;
    local_38 = local_150;
    if (1000.0 <= local_150) {
      local_428[0] = local_138 * 1.58275179e-15 +
                     local_140 * -9.23157818e-12 +
                     local_148 * -5.63382869e-08 + local_150 * 0.000700064411 + 1.99142337;
      local_428[1] = local_138 * -1.13643531e-15 +
                     local_140 * 1.77528148e-11 +
                     local_148 * -1.25884199e-07 + local_150 * 0.000613519689 + 2.69757819;
      local_428[2] = local_138 * -6.39161787e-15 +
                     local_140 * 1.20099639e-10 +
                     local_148 * -8.73026011e-07 + local_150 * 0.00305629289 + 1.67214561;
      local_428[3] = local_138 * 0.0 + local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 1.5;
      local_428[4] = local_138 * -4.3680515e-16 +
                     local_140 * 4.55106742e-12 +
                     local_148 * -3.10280335e-09 + local_150 * -2.75506191e-05 + 1.54205966;
      local_428[5] = local_138 * -1.33195876e-15 +
                     local_140 * 3.05218674e-11 +
                     local_148 * -2.59082758e-07 + local_150 * 0.00105650448 + 1.86472886;
      local_428[6] = local_138 * -1.07908535e-14 +
                     local_140 * 1.1424637e-10 +
                     local_148 * -6.3365815e-07 + local_150 * 0.00223982013 + 3.0172109;
      local_428[7] = local_138 * -1.43165356e-14 +
                     local_140 * 2.34890357e-10 +
                     local_148 * -1.47468882e-06 + local_150 * 0.00433613639 + 3.57316685;
      local_428[8] = local_138 * -6.753351e-15 +
                     local_140 * 1.009704e-10 +
                     local_148 * -5.684761e-07 + local_150 * 0.001487977 + 1.92664;
      local_478[0] = local_140 * 6.33100716e-15 +
                     local_148 * -2.76947345e-11 + local_150 * -1.12676574e-07 + 0.000700064411;
      local_478[1] = local_140 * -4.54574124e-15 +
                     local_148 * 5.32584444e-11 + local_150 * -2.51768398e-07 + 0.000613519689;
      local_478[2] = local_140 * -2.55664715e-14 +
                     local_148 * 3.60298917e-10 + local_150 * -1.74605202e-06 + 0.00305629289;
      local_478[3] = local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 0.0;
      local_478[4] = local_140 * -1.7472206e-15 +
                     local_148 * 1.36532023e-11 + local_150 * -6.2056067e-09 + -2.75506191e-05;
      local_478[5] = local_140 * -5.32783504e-15 +
                     local_148 * 9.15656022e-11 + local_150 * -5.18165516e-07 + 0.00105650448;
      local_478[6] = local_140 * -4.3163414e-14 +
                     local_148 * 3.4273911e-10 + local_150 * -1.2673163e-06 + 0.00223982013;
      local_478[7] = local_140 * -5.72661424e-14 +
                     local_148 * 7.04671071e-10 + local_150 * -2.94937764e-06 + 0.00433613639;
      local_478[8] = local_140 * -2.7013404e-14 +
                     local_148 * 3.029112e-10 + local_150 * -1.1369522e-06 + 0.001487977;
    }
    else {
      local_428[0] = local_138 * 4.13487224e-13 +
                     local_140 * -9.47543433e-11 +
                     local_148 * -8.14301529e-07 + local_150 * 0.000824944174 + 2.29812431;
      local_428[1] = local_138 * -8.76855392e-13 +
                     local_140 * 1.31387723e-09 +
                     local_148 * -5.75615047e-07 + local_150 * 0.00112748635 + 2.2129364;
      local_428[2] = local_138 * -2.50658847e-12 +
                     local_140 * 6.96858127e-09 +
                     local_148 * -6.35469633e-06 + local_150 * 0.00347498246 + 2.38684249;
      local_428[3] = local_138 * 0.0 + local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 1.5;
      local_428[4] = local_138 * 3.89069636e-13 +
                     local_140 * -1.60284319e-09 +
                     local_148 * 2.4210317e-06 + local_150 * -0.00163816649 + 1.94642878;
      local_428[5] = local_138 * 2.06237379e-12 +
                     local_140 * -5.79853643e-09 +
                     local_148 * 6.52764691e-06 + local_150 * -0.00322544939 + 3.12530561;
      local_428[6] = local_138 * 9.29225124e-12 +
                     local_140 * -2.42763894e-08 +
                     local_148 * 2.11582891e-05 + local_150 * -0.00474912051 + 3.30179801;
      local_428[7] = local_138 * 2.47151475e-12 +
                     local_140 * -4.62580552e-09 +
                     local_148 * -1.48501258e-07 + local_150 * 0.00656922581 + 2.38875365;
      local_428[8] = local_138 * -2.444855e-12 +
                     local_140 * 5.641515e-09 +
                     local_148 * -3.963222e-06 + local_150 * 0.00140824 + 2.298677;
      local_478[0] = local_140 * 1.6539489e-12 +
                     local_148 * -2.8426303e-10 + local_150 * -1.62860306e-06 + 0.000824944174;
      local_478[1] = local_140 * -3.50742157e-12 +
                     local_148 * 3.94163169e-09 + local_150 * -1.15123009e-06 + 0.00112748635;
      local_478[2] = local_140 * -1.00263539e-11 +
                     local_148 * 2.09057438e-08 + local_150 * -1.27093927e-05 + 0.00347498246;
      local_478[3] = local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 0.0;
      local_478[4] = local_140 * 1.55627854e-12 +
                     local_148 * -4.80852957e-09 + local_150 * 4.8420634e-06 + -0.00163816649;
      local_478[5] = local_140 * 8.24949516e-12 +
                     local_148 * -1.73956093e-08 + local_150 * 1.30552938e-05 + -0.00322544939;
      local_478[6] = local_140 * 3.7169005e-11 +
                     local_148 * -7.28291682e-08 + local_150 * 4.23165782e-05 + -0.00474912051;
      local_478[7] = local_140 * 9.886059e-12 +
                     local_148 * -1.38774166e-08 + local_150 * -2.97002516e-07 + 0.00656922581;
      local_478[8] = local_140 * -9.77942e-12 +
                     local_148 * 1.6924545e-08 + local_150 * -7.926444e-06 + 0.00140824;
    }
    local_8 = &local_4c8;
    local_10 = &local_158;
    local_18 = local_150;
    local_20 = 1.0 / local_150;
    if (1000.0 <= local_150) {
      local_4c8 = local_20 * -835.033997 +
                  local_138 * 3.16550358e-16 +
                  local_140 * -2.30789455e-12 +
                  local_148 * -1.8779429e-08 + local_150 * 0.000350032206 + 1.99142337;
      local_4c0 = local_20 * -1233.93018 +
                  local_138 * -2.27287062e-16 +
                  local_140 * 4.4382037e-12 +
                  local_148 * -4.19613997e-08 + local_150 * 0.000306759845 + 2.69757819;
      local_4b8 = local_20 * -29899.209 +
                  local_138 * -1.27832357e-15 +
                  local_140 * 3.00249098e-11 +
                  local_148 * -2.9100867e-07 + local_150 * 0.00152814644 + 1.67214561;
      local_4b0 = local_20 * 25471.627 +
                  local_138 * 0.0 + local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 1.5;
      local_4a8 = local_20 * 29230.8027 +
                  local_138 * -8.736103e-17 +
                  local_140 * 1.13776685e-12 +
                  local_148 * -1.03426778e-09 + local_150 * -1.37753096e-05 + 1.54205966;
      local_4a0 = local_20 * 3683.62875 +
                  local_138 * -2.66391752e-16 +
                  local_140 * 7.63046685e-12 +
                  local_148 * -8.63609193e-08 + local_150 * 0.00052825224 + 1.86472886;
      local_498 = local_20 * 111.856713 +
                  local_138 * -2.1581707e-15 +
                  local_140 * 2.85615925e-11 +
                  local_148 * -2.11219383e-07 + local_150 * 0.00111991006 + 3.0172109;
      local_490 = local_20 * -18006.9609 +
                  local_138 * -2.86330712e-15 +
                  local_140 * 5.87225893e-11 +
                  local_148 * -4.9156294e-07 + local_150 * 0.0021680682 + 3.57316685;
      local_488 = local_20 * -922.7977 +
                  local_138 * -1.3506702e-15 +
                  local_140 * 2.52426e-11 +
                  local_148 * -1.89492033e-07 + local_150 * 0.0007439885 + 1.92664;
    }
    else {
      local_4c8 = local_20 * -1012.52087 +
                  local_138 * 8.26974448e-14 +
                  local_140 * -2.36885858e-11 +
                  local_148 * -2.71433843e-07 + local_150 * 0.000412472087 + 2.29812431;
      local_4c0 = local_20 * -1005.24902 +
                  local_138 * -1.75371078e-13 +
                  local_140 * 3.28469308e-10 +
                  local_148 * -1.91871682e-07 + local_150 * 0.000563743175 + 2.2129364;
      local_4b8 = local_20 * -30208.1133 +
                  local_138 * -5.01317694e-13 +
                  local_140 * 1.74214532e-09 +
                  local_148 * -2.11823211e-06 + local_150 * 0.00173749123 + 2.38684249;
      local_4b0 = local_20 * 25471.627 +
                  local_138 * 0.0 + local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 1.5;
      local_4a8 = local_20 * 29147.6445 +
                  local_138 * 7.78139272e-14 +
                  local_140 * -4.00710797e-10 +
                  local_148 * 8.07010567e-07 + local_150 * -0.000819083245 + 1.94642878;
      local_4a0 = local_20 * 3346.30913 +
                  local_138 * 4.12474758e-13 +
                  local_140 * -1.44963411e-09 +
                  local_148 * 2.1758823e-06 + local_150 * -0.0016127247 + 3.12530561;
      local_498 = local_20 * 294.80804 +
                  local_138 * 1.85845025e-12 +
                  local_140 * -6.06909735e-09 +
                  local_148 * 7.05276303e-06 + local_150 * -0.00237456025 + 3.30179801;
      local_490 = local_20 * -17663.1465 +
                  local_138 * 4.9430295e-13 +
                  local_140 * -1.15645138e-09 +
                  local_148 * -4.95004193e-08 + local_150 * 0.0032846129 + 2.38875365;
      local_488 = local_20 * -1020.9 +
                  local_138 * -4.88971e-13 +
                  local_140 * 1.41037875e-09 +
                  local_148 * -1.321074e-06 + local_150 * 0.00070412 + 2.298677;
    }
    local_4d0 = &local_4c8;
  }
  else {
    local_70 = local_428;
    local_78 = &local_158;
    local_80 = local_150;
    if (1000.0 <= local_150) {
      local_428[0] = local_138 * 1.58275179e-15 +
                     local_140 * -9.23157818e-12 +
                     local_148 * -5.63382869e-08 + local_150 * 0.000700064411 + 2.99142337;
      local_428[1] = local_138 * -1.13643531e-15 +
                     local_140 * 1.77528148e-11 +
                     local_148 * -1.25884199e-07 + local_150 * 0.000613519689 + 3.69757819;
      local_428[2] = local_138 * -6.39161787e-15 +
                     local_140 * 1.20099639e-10 +
                     local_148 * -8.73026011e-07 + local_150 * 0.00305629289 + 2.67214561;
      local_428[3] = local_138 * 0.0 + local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 2.5;
      local_428[4] = local_138 * -4.3680515e-16 +
                     local_140 * 4.55106742e-12 +
                     local_148 * -3.10280335e-09 + local_150 * -2.75506191e-05 + 2.54205966;
      local_428[5] = local_138 * -1.33195876e-15 +
                     local_140 * 3.05218674e-11 +
                     local_148 * -2.59082758e-07 + local_150 * 0.00105650448 + 2.86472886;
      local_428[6] = local_138 * -1.07908535e-14 +
                     local_140 * 1.1424637e-10 +
                     local_148 * -6.3365815e-07 + local_150 * 0.00223982013 + 4.0172109;
      local_428[7] = local_138 * -1.43165356e-14 +
                     local_140 * 2.34890357e-10 +
                     local_148 * -1.47468882e-06 + local_150 * 0.00433613639 + 4.57316685;
      local_428[8] = local_138 * -6.753351e-15 +
                     local_140 * 1.009704e-10 +
                     local_148 * -5.684761e-07 + local_150 * 0.001487977 + 2.92664;
      local_478[0] = local_140 * 6.33100716e-15 +
                     local_148 * -2.76947345e-11 + local_150 * -1.12676574e-07 + 0.000700064411;
      local_478[1] = local_140 * -4.54574124e-15 +
                     local_148 * 5.32584444e-11 + local_150 * -2.51768398e-07 + 0.000613519689;
      local_478[2] = local_140 * -2.55664715e-14 +
                     local_148 * 3.60298917e-10 + local_150 * -1.74605202e-06 + 0.00305629289;
      local_478[3] = local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 0.0;
      local_478[4] = local_140 * -1.7472206e-15 +
                     local_148 * 1.36532023e-11 + local_150 * -6.2056067e-09 + -2.75506191e-05;
      local_478[5] = local_140 * -5.32783504e-15 +
                     local_148 * 9.15656022e-11 + local_150 * -5.18165516e-07 + 0.00105650448;
      local_478[6] = local_140 * -4.3163414e-14 +
                     local_148 * 3.4273911e-10 + local_150 * -1.2673163e-06 + 0.00223982013;
      local_478[7] = local_140 * -5.72661424e-14 +
                     local_148 * 7.04671071e-10 + local_150 * -2.94937764e-06 + 0.00433613639;
      local_478[8] = local_140 * -2.7013404e-14 +
                     local_148 * 3.029112e-10 + local_150 * -1.1369522e-06 + 0.001487977;
    }
    else {
      local_428[0] = local_138 * 4.13487224e-13 +
                     local_140 * -9.47543433e-11 +
                     local_148 * -8.14301529e-07 + local_150 * 0.000824944174 + 3.29812431;
      local_428[1] = local_138 * -8.76855392e-13 +
                     local_140 * 1.31387723e-09 +
                     local_148 * -5.75615047e-07 + local_150 * 0.00112748635 + 3.2129364;
      local_428[2] = local_138 * -2.50658847e-12 +
                     local_140 * 6.96858127e-09 +
                     local_148 * -6.35469633e-06 + local_150 * 0.00347498246 + 3.38684249;
      local_428[3] = local_138 * 0.0 + local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 2.5;
      local_428[4] = local_138 * 3.89069636e-13 +
                     local_140 * -1.60284319e-09 +
                     local_148 * 2.4210317e-06 + local_150 * -0.00163816649 + 2.94642878;
      local_428[5] = local_138 * 2.06237379e-12 +
                     local_140 * -5.79853643e-09 +
                     local_148 * 6.52764691e-06 + local_150 * -0.00322544939 + 4.12530561;
      local_428[6] = local_138 * 9.29225124e-12 +
                     local_140 * -2.42763894e-08 +
                     local_148 * 2.11582891e-05 + local_150 * -0.00474912051 + 4.30179801;
      local_428[7] = local_138 * 2.47151475e-12 +
                     local_140 * -4.62580552e-09 +
                     local_148 * -1.48501258e-07 + local_150 * 0.00656922581 + 3.38875365;
      local_428[8] = local_138 * -2.444855e-12 +
                     local_140 * 5.641515e-09 +
                     local_148 * -3.963222e-06 + local_150 * 0.00140824 + 3.298677;
      local_478[0] = local_140 * 1.6539489e-12 +
                     local_148 * -2.8426303e-10 + local_150 * -1.62860306e-06 + 0.000824944174;
      local_478[1] = local_140 * -3.50742157e-12 +
                     local_148 * 3.94163169e-09 + local_150 * -1.15123009e-06 + 0.00112748635;
      local_478[2] = local_140 * -1.00263539e-11 +
                     local_148 * 2.09057438e-08 + local_150 * -1.27093927e-05 + 0.00347498246;
      local_478[3] = local_140 * 0.0 + local_148 * 0.0 + local_150 * 0.0 + 0.0;
      local_478[4] = local_140 * 1.55627854e-12 +
                     local_148 * -4.80852957e-09 + local_150 * 4.8420634e-06 + -0.00163816649;
      local_478[5] = local_140 * 8.24949516e-12 +
                     local_148 * -1.73956093e-08 + local_150 * 1.30552938e-05 + -0.00322544939;
      local_478[6] = local_140 * 3.7169005e-11 +
                     local_148 * -7.28291682e-08 + local_150 * 4.23165782e-05 + -0.00474912051;
      local_478[7] = local_140 * 9.886059e-12 +
                     local_148 * -1.38774166e-08 + local_150 * -2.97002516e-07 + 0.00656922581;
      local_478[8] = local_140 * -9.77942e-12 +
                     local_148 * 1.6924545e-08 + local_150 * -7.926444e-06 + 0.00140824;
    }
    local_4d0 = &local_228;
  }
  local_4d8 = 0.0;
  local_4e0 = 0.0;
  local_4e8 = 0.0;
  local_4f0 = 0.0;
  for (local_4f4 = 0; local_4f4 < 9; local_4f4 = local_4f4 + 1) {
    local_4d8 = local_428[local_4f4] * local_d0[local_4f4] + local_4d8;
    local_4e8 = local_478[local_4f4] * local_d0[local_4f4] + local_4e8;
    local_4e0 = local_4d0[local_4f4] * local_128[local_4f4] + local_4e0;
    local_4f0 = local_160 * (local_428[local_4f4] - local_4d0[local_4f4]) * local_128[local_4f4] +
                local_4d0[local_4f4] * local_c8[local_4f4 + 0x5a] + local_4f0;
  }
  local_500 = 1.0 / local_4d8;
  dVar2 = local_4e0 * local_500;
  local_508 = dVar2;
  dVar3 = local_500 * local_d8;
  local_510 = dVar3;
  dVar4 = dVar2 * dVar3;
  local_518 = dVar4;
  for (local_524 = 0; local_524 < 9; local_524 = local_524 + 1) {
    local_520 = 0.0;
    for (local_528 = 0; local_528 < 9; local_528 = local_528 + 1) {
      local_520 = local_4d0[local_528] * local_c8[local_524 * 10 + local_528] + local_520;
    }
    local_c8[local_524 * 10 + 9] = dVar4 * local_428[local_524] + -(dVar3 * local_520);
  }
  local_c8[99] = -dVar3 * local_4f0 + dVar4 * local_4e8 + -dVar2;
  if (local_594 == 1) {
    *local_588 = 1;
    local_908 = 1;
    for (local_90c = 0; local_90c < 10; local_90c = local_90c + 1) {
      for (local_910 = 0; local_910 < 10; local_910 = local_910 + 1) {
        if (local_910 == local_90c) {
          *(int *)(local_580 + (long)(local_908 + -1) * 4) = local_90c + 1;
          local_908 = local_908 + 1;
        }
        else if ((local_8b8[local_910 * 10 + local_90c] != 0.0) ||
                (NAN(local_8b8[local_910 * 10 + local_90c]))) {
          *(int *)(local_580 + (long)(local_908 + -1) * 4) = local_910 + 1;
          local_908 = local_908 + 1;
        }
      }
      local_588[local_90c + 1] = local_908;
    }
  }
  else {
    *local_588 = 0;
    local_914 = 0;
    for (local_918 = 0; local_918 < 10; local_918 = local_918 + 1) {
      for (local_91c = 0; local_91c < 10; local_91c = local_91c + 1) {
        if (local_91c == local_918) {
          *(int *)(local_580 + (long)local_914 * 4) = local_918;
          local_914 = local_914 + 1;
        }
        else if ((local_8b8[local_91c * 10 + local_918] != 0.0) ||
                (NAN(local_8b8[local_91c * 10 + local_918]))) {
          *(int *)(local_580 + (long)local_914 * 4) = local_91c;
          local_914 = local_914 + 1;
        }
      }
      local_588[local_918 + 1] = local_914;
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
  int* colVals, int* rowPtr, const int* consP, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp - 1] = l + 1;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp] = l;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  }
}